

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sreadhb.c
# Opt level: O1

int sReadValues(FILE *fp,int n,float *destination,int perline,int persize)

{
  long lVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  char buf [100];
  byte local_98 [104];
  
  if (0 < n) {
    lVar5 = 0;
    do {
      fgets((char *)local_98,100,(FILE *)fp);
      if (0 < perline) {
        lVar5 = (long)(int)lVar5;
        uVar7 = 0;
        lVar3 = 0;
        do {
          lVar1 = lVar3 + 1;
          lVar6 = lVar1 * persize;
          bVar2 = local_98[lVar6];
          local_98[lVar6] = 0;
          if (0 < persize) {
            uVar4 = 0;
            do {
              if ((local_98[uVar4 + uVar7] | 0x20) == 100) {
                local_98[uVar4 + uVar7] = 0x45;
              }
              uVar4 = uVar4 + 1;
            } while ((uint)persize != uVar4);
          }
          dVar8 = atof((char *)(local_98 + lVar3 * persize));
          destination[lVar5] = (float)dVar8;
          lVar5 = lVar5 + 1;
          local_98[lVar6] = bVar2;
        } while ((lVar1 < perline) &&
                (uVar7 = (ulong)(uint)((int)uVar7 + persize), lVar3 = lVar1,
                lVar5 < (long)(ulong)(uint)n));
      }
    } while ((int)lVar5 < n);
  }
  return 0;
}

Assistant:

int sReadValues(FILE *fp, int n, float *destination, int perline, int persize)
{
    register int i, j, k, s;
    char tmp, buf[100];
    
    i = 0;
    while (i < n) {
	fgets(buf, 100, fp);    /* read a line at a time */
	for (j=0; j<perline && i<n; j++) {
	    tmp = buf[(j+1)*persize];     /* save the char at that place */
	    buf[(j+1)*persize] = 0;       /* null terminate */
	    s = j*persize;
	    for (k = 0; k < persize; ++k) /* No D_ format in C */
		if ( buf[s+k] == 'D' || buf[s+k] == 'd' ) buf[s+k] = 'E';
	    destination[i++] = atof(&buf[s]);
	    buf[(j+1)*persize] = tmp;     /* recover the char at that place */
	}
    }

    return 0;
}